

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O1

void unlink_objsymbol(Symbol *delsym)

{
  Symbol **ppSVar1;
  Symbol *pSVar2;
  ObjectUnit *pOVar3;
  unsigned_long uVar4;
  Symbol **ppSVar5;
  char *pcVar6;
  char *errtxt;
  
  if (delsym->relsect == (Section *)0x0) {
    pOVar3 = (ObjectUnit *)0x0;
  }
  else {
    pOVar3 = delsym->relsect->obj;
  }
  if (pOVar3 == (ObjectUnit *)0x0) {
    pcVar6 = delsym->name;
    errtxt = "%s %s has no object or section";
  }
  else {
    ppSVar1 = pOVar3->objsyms;
    uVar4 = elf_hash(delsym->name);
    ppSVar1 = ppSVar1 + ((uint)uVar4 & 0x1f);
    do {
      ppSVar5 = ppSVar1;
      pSVar2 = *ppSVar5;
      if (pSVar2 == (Symbol *)0x0) break;
      ppSVar1 = &pSVar2->obj_chain;
    } while (pSVar2 != delsym);
    if (pSVar2 != (Symbol *)0x0) {
      *ppSVar5 = delsym->obj_chain;
      delsym->obj_chain = (Symbol *)0x0;
      return;
    }
    pcVar6 = delsym->name;
    errtxt = "%s %s could not be found in any object";
  }
  ierror(errtxt,"unlink_objsymbol():",pcVar6);
  return;
}

Assistant:

static void unlink_objsymbol(struct Symbol *delsym)
/* unlink a symbol from an object unit's hash chain */
{
  const char *fn = "unlink_objsymbol():";
  struct ObjectUnit *ou = delsym->relsect ? delsym->relsect->obj : NULL;

  if (ou) {
    struct Symbol **chain = &ou->objsyms[elf_hash(delsym->name)%OBJSYMHTABSIZE];
    struct Symbol *sym;

    while (sym = *chain) {
      if (sym == delsym)
        break;
      chain = &sym->obj_chain;
    }
    if (sym) {
      /* unlink the symbol node from the chain */
      *chain = delsym->obj_chain;
      delsym->obj_chain = NULL;
    }
    else
      ierror("%s %s could not be found in any object",fn,delsym->name);
  }
  else
    ierror("%s %s has no object or section",fn,delsym->name);
}